

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgrays.c
# Opt level: O1

void gray_record_cell(gray_PWorker worker)

{
  PCell pTVar1;
  int iVar2;
  long lVar3;
  PCell *ppTVar4;
  PCell_conflict pTVar5;
  PCell_conflict pTVar6;
  int iVar7;
  
  iVar2 = worker->ex;
  ppTVar4 = worker->ycells + ((long)worker->ey - (long)worker->min_ey);
  pTVar6 = *ppTVar4;
  if ((pTVar6 != (PCell_conflict)0x0) && (iVar7 = pTVar6->x, iVar7 <= iVar2)) {
    do {
      pTVar5 = pTVar6;
      if (iVar7 == iVar2) {
        pTVar5->area = pTVar5->area + worker->area;
        pTVar5->cover = pTVar5->cover + worker->cover;
        return;
      }
      pTVar6 = pTVar5->next;
    } while ((pTVar6 != (PCell)0x0) && (iVar7 = pTVar6->x, iVar7 <= iVar2));
    ppTVar4 = &pTVar5->next;
  }
  lVar3 = worker->num_cells;
  if (lVar3 < worker->max_cells) {
    worker->num_cells = lVar3 + 1;
    pTVar1 = worker->cells + lVar3;
    pTVar1->x = iVar2;
    pTVar1->area = worker->area;
    pTVar1->cover = worker->cover;
    pTVar1->next = pTVar6;
    *ppTVar4 = pTVar1;
    return;
  }
  longjmp((__jmp_buf_tag *)worker,1);
}

Assistant:

static void
  gray_record_cell( RAS_ARG )
  {
    PCell  *pcell, cell;
    TCoord  x = ras.ex;


    pcell = &ras.ycells[ras.ey - ras.min_ey];
    for (;;)
    {
      cell = *pcell;
      if ( !cell || cell->x > x )
        break;

      if ( cell->x == x )
        goto Found;

      pcell = &cell->next;
    }

    if ( ras.num_cells >= ras.max_cells )
      ft_longjmp( ras.jump_buffer, 1 );

    /* insert new cell */
    cell        = ras.cells + ras.num_cells++;
    cell->x     = x;
    cell->area  = ras.area;
    cell->cover = ras.cover;

    cell->next  = *pcell;
    *pcell      = cell;

    return;

  Found:
    /* update old cell */
    cell->area  += ras.area;
    cell->cover += ras.cover;
  }